

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

pair<bool,_std::pair<const_char_*,_unsigned_long>_> * __thiscall
Fixpp::impl::matchTag<Fixpp::TagT<8u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
          (pair<bool,_std::pair<const_char_*,_unsigned_long>_> *__return_storage_ptr__,impl *this,
          StreamCursor *cursor)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  size_t count;
  byte *pbVar7;
  int unaff_R15D;
  bool bVar8;
  undefined1 auStack_58 [8];
  pair<const_char_*,_unsigned_long> ret;
  
  plVar1 = *(long **)this;
  lVar2 = plVar1[1];
  lVar3 = plVar1[2];
  lVar4 = plVar1[3];
  if ((lVar4 == lVar3) && (lVar6 = (**(code **)(*plVar1 + 0x38))(), lVar6 == 0)) {
    bVar8 = false;
  }
  else {
    plVar1 = *(long **)this;
    pbVar7 = (byte *)plVar1[2];
    lVar6 = plVar1[3] - (long)pbVar7;
    if (lVar6 == 0) {
      lVar6 = (**(code **)(*plVar1 + 0x38))();
    }
    count = 0;
    unaff_R15D = 0;
    do {
      if ((byte)(*pbVar7 - 0x30) < 10) {
        unaff_R15D = (uint)*pbVar7 + unaff_R15D * 10 + -0x30;
        count = count + 1;
        lVar6 = lVar6 + -1;
        bVar8 = lVar6 != 0;
      }
      else {
        bVar8 = false;
      }
      pbVar7 = pbVar7 + 1;
    } while (bVar8);
    bVar8 = count != 0;
    if (bVar8) {
      bVar8 = true;
      StreamCursor::advance((StreamCursor *)this,count);
    }
  }
  if (((bVar8) && (unaff_R15D == 8)) &&
     ((plVar1 = *(long **)this, plVar1[3] != plVar1[2] ||
      (lVar6 = (**(code **)(*plVar1 + 0x38))(), lVar6 != 0)))) {
    plVar1 = *(long **)this;
    if ((char *)plVar1[2] < (char *)plVar1[3]) {
      cVar5 = *(char *)plVar1[2];
    }
    else {
      cVar5 = (**(code **)(*plVar1 + 0x48))();
    }
    if (cVar5 == '=') {
      StreamCursor::advance((StreamCursor *)this,1);
      auStack_58 = (undefined1  [8])0x0;
      ret.first = (char *)0x0;
      bVar8 = TagMatcher<Fixpp::Type::String>::matchValue((Return *)auStack_58,(StreamCursor *)this)
      ;
      if (bVar8) {
        __return_storage_ptr__->first = true;
        (__return_storage_ptr__->second).first = (char *)auStack_58;
        (__return_storage_ptr__->second).second = (unsigned_long)ret.first;
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->second).first = (char *)0x0;
      (__return_storage_ptr__->second).second = 0;
      __return_storage_ptr__->first = false;
      goto LAB_00400ea0;
    }
  }
  (__return_storage_ptr__->second).first = (char *)0x0;
  (__return_storage_ptr__->second).second = 0;
  __return_storage_ptr__->first = false;
LAB_00400ea0:
  lVar6 = *(long *)this;
  *(long *)(lVar6 + 8) = lVar2;
  *(long *)(lVar6 + 0x10) = lVar3;
  *(long *)(lVar6 + 0x18) = lVar4;
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, Ret> matchTag(StreamCursor& cursor)
        {
            #define TRY_MATCH(...) \
            if (!__VA_ARGS__) \
               return std::make_pair(false, Ret {})

            StreamCursor::Revert revert(cursor);

            int tag;
            TRY_MATCH(match_int_fast(&tag, cursor));

            if (tag != Tag::Id)
               return std::make_pair(false, Ret {});

            TRY_MATCH(match_literal_fast('=', cursor));

            Ret ret;

            TRY_MATCH(TagMatcher<typename Tag::Type>::matchValue(&ret, cursor));

            revert.ignore();

            return std::make_pair(true, ret);

            #undef TRY_MATCH
        }